

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall QPlainTextEdit::dragMoveEvent(QPlainTextEdit *this,QDragMoveEvent *e)

{
  QPlainTextEditPrivate *this_00;
  QPlainTextEditControl *this_01;
  QScrollBar *this_02;
  bool bVar1;
  qreal qVar2;
  LayoutDirection LVar3;
  int iVar4;
  int iVar5;
  QPoint QVar6;
  long in_FS_OFFSET;
  double dVar7;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  dVar7 = (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
          *(double *)(e + 0x10);
  bVar1 = 2147483647.0 < dVar7;
  if (dVar7 <= -2147483648.0) {
    dVar7 = -2147483648.0;
  }
  QVar6.xp.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar7);
  dVar7 = (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
          *(double *)(e + 0x18);
  bVar1 = 2147483647.0 < dVar7;
  if (dVar7 <= -2147483648.0) {
    dVar7 = -2147483648.0;
  }
  QVar6.yp.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar7);
  this_00->autoScrollDragPos = QVar6;
  if ((this_00->autoScrollTimer).m_id == Invalid) {
    QBasicTimer::start(&this_00->autoScrollTimer,100000000,1,this);
  }
  this_01 = this_00->control;
  LVar3 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  this_02 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
  if (LVar3 == RightToLeft) {
    iVar4 = QAbstractSlider::maximum(&this_02->super_QAbstractSlider);
    iVar5 = QAbstractSlider::value
                      (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    iVar4 = iVar4 - iVar5;
  }
  else {
    iVar4 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
  }
  qVar2 = QPlainTextEditPrivate::verticalOffset(this_00,this_00->control->topBlock,this_00->topLine)
  ;
  local_38.yp = qVar2 + this_00->topLineFracture;
  local_38.xp = (double)iVar4;
  QWidgetTextControl::processEvent
            ((QWidgetTextControl *)this_01,(QEvent *)e,&local_38,
             (this_00->super_QAbstractScrollAreaPrivate).viewport);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEdit::dragMoveEvent(QDragMoveEvent *e)
{
    Q_D(QPlainTextEdit);
    d->autoScrollDragPos = e->position().toPoint();
    if (!d->autoScrollTimer.isActive())
        d->autoScrollTimer.start(100, this);
    d->sendControlEvent(e);
}